

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void instruct_cbr(Proc *proc,Pseudo *condition_pseudo,BasicBlock *true_block,BasicBlock *false_block
                 ,uint line_number)

{
  Pseudo *pseudo;
  Pseudo *pseudo_00;
  Instruction *insn_00;
  Pseudo *pseudo_01;
  Pseudo *tofree;
  Instruction *insn;
  Pseudo *false_pseudo;
  Pseudo *true_pseudo;
  uint line_number_local;
  BasicBlock *false_block_local;
  BasicBlock *true_block_local;
  Pseudo *condition_pseudo_local;
  Proc *proc_local;
  
  pseudo = allocate_block_pseudo(proc,true_block);
  pseudo_00 = allocate_block_pseudo(proc,false_block);
  insn_00 = allocate_instruction(proc,op_cbr,line_number);
  pseudo_01 = add_instruction_operand(proc,insn_00,condition_pseudo);
  add_instruction_target(proc,insn_00,pseudo);
  add_instruction_target(proc,insn_00,pseudo_00);
  add_instruction(proc,insn_00);
  if (pseudo_01 != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pseudo_01,false);
  }
  return;
}

Assistant:

static void instruct_cbr(Proc *proc, Pseudo *condition_pseudo, BasicBlock *true_block,
			 BasicBlock *false_block, unsigned line_number)
{
	Pseudo *true_pseudo = allocate_block_pseudo(proc, true_block);
	Pseudo *false_pseudo = allocate_block_pseudo(proc, false_block);
	Instruction *insn = allocate_instruction(proc, op_cbr, line_number);
	Pseudo *tofree = add_instruction_operand(proc, insn, condition_pseudo);
	add_instruction_target(proc, insn, true_pseudo);
	add_instruction_target(proc, insn, false_pseudo);
	add_instruction(proc, insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
}